

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::sectionEnded
          (CumulativeReporterBase<Catch::SonarQubeReporter> *this,SectionStats *sectionStats)

{
  SectionStats::operator=
            (&((this->m_sectionStack).
               super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super___shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->stats,sectionStats);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>
  ::pop_back(&this->m_sectionStack);
  return;
}

Assistant:

void sectionEnded(SectionStats const& sectionStats) override {
            assert(!m_sectionStack.empty());
            SectionNode& node = *m_sectionStack.back();
            node.stats = sectionStats;
            m_sectionStack.pop_back();
        }